

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestProto3Optional::_InternalSerialize
          (TestProto3Optional *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  int32_t iVar7;
  long lVar8;
  uint64_t uVar9;
  int64_t iVar10;
  TestProto3Optional_NestedMessage *pTVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint uVar15;
  ulong uVar16;
  char *in_R9;
  undefined8 *puVar17;
  byte *pbVar18;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view field_name;
  string_view field_name_00;
  
  uVar4 = *(uint *)&this->field_0;
  if ((uVar4 & 0x40) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.optional_int32_,target);
  }
  if ((uVar4 & 0x20) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.optional_int64_,target);
  }
  if ((char)uVar4 < '\0') {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar15 = (this->field_0)._impl_.optional_uint32_;
    *target = 0x18;
    pbVar18 = target + 1;
    uVar12 = uVar15;
    if (0x7f < uVar15) {
      do {
        *pbVar18 = (byte)uVar12 | 0x80;
        uVar15 = uVar12 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar12;
        uVar12 = uVar15;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar15;
    target = pbVar18 + 1;
  }
  if ((uVar4 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar16 = (this->field_0)._impl_.optional_uint64_;
    *target = 0x20;
    pbVar18 = target + 1;
    uVar13 = uVar16;
    if (0x7f < uVar16) {
      do {
        *pbVar18 = (byte)uVar13 | 0x80;
        uVar16 = uVar13 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar13;
        uVar13 = uVar16;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar16;
    target = pbVar18 + 1;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar5 = (this->field_0)._impl_.optional_sint32_;
    *target = 0x28;
    pbVar18 = target + 1;
    uVar12 = iVar5 >> 0x1f ^ iVar5 * 2;
    uVar15 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar18 = (byte)uVar15 | 0x80;
        uVar12 = uVar15 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar15;
        uVar15 = uVar12;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar12;
    target = pbVar18 + 1;
  }
  if ((uVar4 >> 9 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    lVar8 = (this->field_0)._impl_.optional_sint64_;
    *target = 0x30;
    pbVar18 = target + 1;
    uVar13 = lVar8 >> 0x3f ^ lVar8 * 2;
    uVar16 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar18 = (byte)uVar16 | 0x80;
        uVar13 = uVar16 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar16;
        uVar16 = uVar13;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar13;
    target = pbVar18 + 1;
  }
  if ((uVar4 >> 0xb & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = (this->field_0)._impl_.optional_fixed32_;
    *target = 0x3d;
    *(uint32_t *)(target + 1) = uVar6;
    target = target + 5;
  }
  if ((uVar4 >> 0xc & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = (this->field_0)._impl_.optional_fixed64_;
    *target = 0x41;
    *(uint64_t *)(target + 1) = uVar9;
    target = target + 9;
  }
  if ((uVar4 >> 0xe & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar7 = (this->field_0)._impl_.optional_sfixed32_;
    *target = 0x4d;
    *(int32_t *)(target + 1) = iVar7;
    target = target + 5;
  }
  if ((uVar4 >> 0xd & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar10 = (this->field_0)._impl_.optional_sfixed64_;
    *target = 0x51;
    *(int64_t *)(target + 1) = iVar10;
    target = target + 9;
  }
  if ((short)uVar4 < 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar1 = (this->field_0)._impl_.optional_float_;
    *target = 0x5d;
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar4 >> 0x10 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    dVar2 = (this->field_0)._impl_.optional_double_;
    *target = 0x61;
    *(double *)(target + 1) = dVar2;
    target = target + 9;
  }
  if ((uVar4 >> 0x11 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar3 = (this->field_0)._impl_.optional_bool_;
    *target = 0x68;
    target[1] = bVar3;
    target = target + 2;
  }
  if ((uVar4 & 1) != 0) {
    puVar17 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestProto3Optional.optional_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar17,(char *)(ulong)*(uint *)(puVar17 + 1),1,0x32,field_name);
    s._M_str = (char *)*puVar17;
    s._M_len = puVar17[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xe,s,target)
    ;
  }
  if ((uVar4 & 2) != 0) {
    puVar17 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s_00._M_str = (char *)*puVar17;
    s_00._M_len = puVar17[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xf,s_00,target);
  }
  if ((uVar4 & 4) != 0) {
    puVar17 = (undefined8 *)
              ((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"proto2_unittest.TestProto3Optional.optional_cord";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar17,(char *)(ulong)*(uint *)(puVar17 + 1),1,0x30,field_name_00
              );
    s_01._M_str = (char *)*puVar17;
    s_01._M_len = puVar17[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x10,s_01,target);
  }
  if ((uVar4 & 8) != 0) {
    pTVar11 = (this->field_0)._impl_.optional_nested_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x12,(MessageLite *)pTVar11,*(int *)((long)&pTVar11->field_0 + 4),target,
                        stream);
  }
  if ((uVar4 & 0x10) != 0) {
    pTVar11 = (this->field_0)._impl_.lazy_nested_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x13,(MessageLite *)pTVar11,*(int *)((long)&pTVar11->field_0 + 4),target,
                        stream);
  }
  if ((uVar4 >> 0x12 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar13 = (ulong)(this->field_0)._impl_.optional_nested_enum_;
    pbVar18 = target + 2;
    target[0] = 0xa8;
    target[1] = 1;
    uVar16 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar18 = (byte)uVar16 | 0x80;
        uVar13 = uVar16 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar16;
        uVar16 = uVar13;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar13;
    target = pbVar18 + 1;
  }
  if (((uVar4 >> 0x14 & 1) != 0) && ((this->field_0)._impl_.singular_int32_ != 0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar13 = (ulong)(this->field_0)._impl_.singular_int32_;
    pbVar18 = target + 2;
    target[0] = 0xb0;
    target[1] = 1;
    uVar16 = uVar13;
    if (0x7f < uVar13) {
      do {
        *pbVar18 = (byte)uVar16 | 0x80;
        uVar13 = uVar16 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar16;
        uVar16 = uVar13;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar13;
    target = pbVar18 + 1;
  }
  if (((uVar4 >> 0x13 & 1) != 0) && ((this->field_0)._impl_.singular_int64_ != 0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar16 = (this->field_0)._impl_.singular_int64_;
    target[0] = 0xb8;
    target[1] = 1;
    pbVar18 = target + 2;
    uVar13 = uVar16;
    if (0x7f < uVar16) {
      do {
        *pbVar18 = (byte)uVar13 | 0x80;
        uVar16 = uVar13 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar3 = 0x3fff < uVar13;
        uVar13 = uVar16;
      } while (bVar3);
    }
    *pbVar18 = (byte)uVar16;
    target = pbVar18 + 1;
  }
  uVar16 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar16 & 1) != 0) {
    puVar14 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((uVar16 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar14;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3Optional::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3Optional& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestProto3Optional)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 optional_int32 = 1;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32(), target);
  }

  // optional int64 optional_int64 = 2;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>(
            stream, this_._internal_optional_int64(), target);
  }

  // optional uint32 optional_uint32 = 3;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_optional_uint32(), target);
  }

  // optional uint64 optional_uint64 = 4;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_optional_uint64(), target);
  }

  // optional sint32 optional_sint32 = 5;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_optional_sint32(), target);
  }

  // optional sint64 optional_sint64 = 6;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_optional_sint64(), target);
  }

  // optional fixed32 optional_fixed32 = 7;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_optional_fixed32(), target);
  }

  // optional fixed64 optional_fixed64 = 8;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_optional_fixed64(), target);
  }

  // optional sfixed32 optional_sfixed32 = 9;
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_optional_sfixed32(), target);
  }

  // optional sfixed64 optional_sfixed64 = 10;
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_optional_sfixed64(), target);
  }

  // optional float optional_float = 11;
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_optional_float(), target);
  }

  // optional double optional_double = 12;
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_optional_double(), target);
  }

  // optional bool optional_bool = 13;
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_optional_bool(), target);
  }

  // optional string optional_string = 14;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_string");
    target = stream->WriteStringMaybeAliased(14, _s, target);
  }

  // optional bytes optional_bytes = 15;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(15, _s, target);
  }

  // optional string optional_cord = 16 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_optional_cord();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_cord");
    target = stream->WriteStringMaybeAliased(16, _s, target);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage optional_nested_message = 18;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage lazy_nested_message = 19 [lazy = true];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        19, *this_._impl_.lazy_nested_message_, this_._impl_.lazy_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedEnum optional_nested_enum = 21;
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        21, this_._internal_optional_nested_enum(), target);
  }

  // int32 singular_int32 = 22;
  if ((cached_has_bits & 0x00100000u) != 0) {
    if (this_._internal_singular_int32() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt32ToArray(
          22, this_._internal_singular_int32(), target);
    }
  }

  // int64 singular_int64 = 23;
  if ((cached_has_bits & 0x00080000u) != 0) {
    if (this_._internal_singular_int64() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt64ToArray(
          23, this_._internal_singular_int64(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestProto3Optional)
  return target;
}